

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDAReInit(void *ida_mem,sunrealtype t0,N_Vector yy0,N_Vector yp0)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x23d;
  }
  else if (*(int *)((long)ida_mem + 0x3d0) == 0) {
    msgfmt = "Attempt to call before IDAMalloc.";
    error_code = -0x17;
    line = 0x248;
  }
  else if (yy0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    error_code = -0x16;
    line = 0x252;
  }
  else {
    if (yp0 != (N_Vector)0x0) {
      *(sunrealtype *)((long)ida_mem + 0x2a8) = t0;
      N_VScale(0,yy0,*(undefined8 *)((long)ida_mem + 0x60));
      N_VScale(0,yp0,*(undefined8 *)((long)ida_mem + 0x68));
      *(undefined4 *)((long)ida_mem + 0x26c) = 0;
      *(undefined8 *)((long)ida_mem + 0x298) = 0;
      *(undefined8 *)((long)ida_mem + 0x360) = 0;
      *(undefined8 *)((long)ida_mem + 0x368) = 0;
      *(undefined8 *)((long)ida_mem + 0x370) = 0;
      *(undefined8 *)((long)ida_mem + 0x378) = 0;
      *(undefined8 *)((long)ida_mem + 0x380) = 0;
      *(undefined8 *)((long)ida_mem + 0x388) = 0;
      *(undefined8 *)((long)ida_mem + 0x390) = 0;
      *(undefined8 *)((long)ida_mem + 0x3b8) = 0x3ff0000000000000;
      *(undefined8 *)((long)ida_mem + 0x498) = 0;
      *(undefined4 *)((long)ida_mem + 0x494) = 0;
      *(undefined4 *)((long)ida_mem + 0x3c0) = 0;
      return 0;
    }
    msgfmt = "yp0 = NULL illegal.";
    error_code = -0x16;
    line = 0x25a;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAReInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAReInit(void* ida_mem, sunrealtype t0, N_Vector yy0, N_Vector yp0)
{
  IDAMem IDA_mem;

  /* Check for legal input parameters */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if problem was malloc'ed */

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_MALLOC);
  }

  /* Check for legal input parameters */

  if (yy0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_Y0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (yp0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YP0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Copy the input parameters into IDA memory block */

  IDA_mem->ida_tn = t0;

  /* Initialize the phi array */

  N_VScale(ONE, yy0, IDA_mem->ida_phi[0]);
  N_VScale(ONE, yp0, IDA_mem->ida_phi[1]);

  /* Initialize all the counters and other optional output values */

  IDA_mem->ida_nst     = 0;
  IDA_mem->ida_nre     = 0;
  IDA_mem->ida_ncfn    = 0;
  IDA_mem->ida_netf    = 0;
  IDA_mem->ida_nni     = 0;
  IDA_mem->ida_nnf     = 0;
  IDA_mem->ida_nsetups = 0;

  IDA_mem->ida_kused = 0;
  IDA_mem->ida_hused = ZERO;
  IDA_mem->ida_tolsf = ONE;

  IDA_mem->ida_nge = 0;

  IDA_mem->ida_irfnd = 0;

  /* Initial setup not done yet */

  IDA_mem->ida_SetupDone = SUNFALSE;

  /* Problem has been successfully re-initialized */

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}